

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btorsimbv.c
# Opt level: O2

BtorSimBitVector * btorsim_bv_slte(BtorSimBitVector *a,BtorSimBitVector *b)

{
  uint uVar1;
  uint uVar2;
  uint32_t uVar3;
  BtorSimBitVector *bv;
  bool bVar4;
  bool bVar5;
  
  bv = btorsim_bv_new(1);
  uVar1 = a->len;
  uVar2 = a->width - 1;
  bVar4 = ((&a[1].width)[~(uVar2 >> 5) + uVar1] >> (uVar2 & 0x1f) & 1) != 0;
  uVar2 = b->width - 1;
  bVar5 = ((&b[1].width)[~(uVar2 >> 5) + b->len] >> (uVar2 & 0x1f) & 1) != 0;
  if (bVar4 == bVar5) {
    uVar3 = find_diff_index(a,b);
    bVar4 = true;
    if (uVar3 < uVar1) {
      bVar4 = (&a[1].width)[uVar3] <= (&b[1].width)[uVar3];
    }
  }
  else {
    bVar4 = bVar4 && !bVar5;
  }
  btorsim_bv_set_bit(bv,0,(uint)bVar4);
  return bv;
}

Assistant:

BtorSimBitVector *
btorsim_bv_slte (const BtorSimBitVector *a, const BtorSimBitVector *b)
{
  assert (a);
  assert (b);
  assert (a->len == b->len);
  assert (a->width == b->width);

  uint32_t i, bit, sign_a, sign_b;
  BtorSimBitVector *res;

  res = btorsim_bv_new (1);
  bit = 1;

  sign_a = btorsim_bv_get_bit (a, a->width - 1);
  sign_b = btorsim_bv_get_bit (b, b->width - 1);

  if (sign_a == sign_b)
  {
    i = find_diff_index (a, b);
    if (i < a->len && a->bits[i] > b->bits[i]) bit = 0;
  }
  else
  {
    bit = sign_a && !sign_b;
  }

  btorsim_bv_set_bit (res, 0, bit);

  assert (rem_bits_zero_dbg (res));
  return res;
}